

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int trex_element(TRex *exp)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  TRexNode *pTVar4;
  bool bVar5;
  int c_1;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ushort **ppuVar11;
  char **ppcVar12;
  char *pcVar13;
  char cVar14;
  uint uVar15;
  TRexNodeType TVar16;
  int c;
  int iVar17;
  
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  if (0x2d < bVar2) {
    if (bVar2 == 0x2e) {
      exp->_p = (char *)(pbVar3 + 1);
      TVar16 = 0x104;
      goto LAB_0010ad02;
    }
    if (bVar2 != 0x5b) goto LAB_0010acd6;
    exp->_p = (char *)(pbVar3 + 1);
    if (pbVar3[1] == 0x5e) {
      iVar6 = trex_newnode(exp,0x107);
      exp->_p = exp->_p + 1;
    }
    else {
      iVar6 = trex_newnode(exp,0x105);
    }
    pcVar13 = exp->_p;
    cVar14 = *pcVar13;
    if (cVar14 != ']') {
      iVar7 = iVar6;
      iVar17 = -1;
      do {
        iVar9 = iVar17;
        if (pcVar13 == exp->_eol) break;
        if (iVar17 == -1 || cVar14 != '-') {
          if (iVar17 == -1) {
            iVar9 = trex_charnode(exp,1);
          }
          else {
            exp->_nodes[iVar7].next = iVar17;
            iVar9 = trex_charnode(exp,1);
            iVar7 = iVar17;
          }
        }
        else {
          exp->_p = pcVar13 + 1;
          if (*pcVar13 == ']') {
            ppcVar12 = exp->_error;
            if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
            pcVar13 = "unfinished range";
            goto LAB_0010b0d3;
          }
          iVar8 = trex_newnode(exp,0x108);
          pcVar13 = exp->_p;
          if (*pcVar13 < iVar17) {
            ppcVar12 = exp->_error;
            if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
            pcVar13 = "invalid range";
            goto LAB_0010b0d3;
          }
          pTVar4 = exp->_nodes;
          if (pTVar4[iVar17].type == 0x106) {
            ppcVar12 = exp->_error;
            if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
            pcVar13 = "cannot use character classes in ranges";
            goto LAB_0010b0d3;
          }
          pTVar4[iVar8].left = pTVar4[iVar17].type;
          cVar14 = *pcVar13;
          if ((long)cVar14 == 0x5c) {
            pcVar1 = pcVar13 + 1;
            exp->_p = pcVar1;
            uVar10 = (int)pcVar13[1] - 0x66U >> 1;
            uVar15 = uVar10 | (uint)(((int)pcVar13[1] - 0x66U & 1) != 0) << 0x1f;
            exp->_p = pcVar13 + 2;
            pcVar13 = pcVar1;
            if ((uVar15 < 9) && ((0x1d1U >> (uVar10 & 0x1f) & 1) != 0)) {
              pcVar13 = &DAT_0010d488 + uVar15;
            }
          }
          else {
            ppuVar11 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar11 + (long)cVar14 * 2 + 1) & 0x40) == 0) {
              ppcVar12 = exp->_error;
              if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
              pcVar13 = "letter expected";
              goto LAB_0010b0d3;
            }
            exp->_p = pcVar13 + 1;
          }
          pTVar4[iVar8].right = (int)*pcVar13;
          pTVar4[iVar7].next = iVar8;
          iVar9 = -1;
          iVar7 = iVar8;
        }
        pcVar13 = exp->_p;
        cVar14 = *pcVar13;
        iVar17 = iVar9;
      } while (cVar14 != ']');
      if (iVar9 != -1) {
        exp->_nodes[iVar7].next = iVar9;
      }
      pTVar4 = exp->_nodes;
      pTVar4[iVar6].left = pTVar4[iVar6].next;
      pTVar4[iVar6].next = -1;
      iVar7 = 0x5d;
      goto LAB_0010aecd;
    }
    ppcVar12 = exp->_error;
    if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
    pcVar13 = "empty class";
    goto LAB_0010b0d3;
  }
  if (bVar2 == 0x24) {
    exp->_p = (char *)(pbVar3 + 1);
    TVar16 = 0x10a;
LAB_0010ad02:
    iVar6 = trex_newnode(exp,TVar16);
  }
  else if (bVar2 == 0x28) {
    exp->_p = (char *)(pbVar3 + 1);
    TVar16 = 0x102;
    if (pbVar3[1] == 0x3f) {
      exp->_p = (char *)(pbVar3 + 2);
      trex_expect(exp,0x3a);
      TVar16 = 0x103;
    }
    iVar6 = trex_newnode(exp,TVar16);
    iVar7 = trex_list(exp);
    exp->_nodes[iVar6].left = iVar7;
    iVar7 = 0x29;
LAB_0010aecd:
    trex_expect(exp,iVar7);
  }
  else {
LAB_0010acd6:
    iVar6 = trex_charnode(exp,0);
  }
  pbVar3 = (byte *)exp->_p;
  bVar2 = *pbVar3;
  uVar10 = 0;
  bVar5 = true;
  if (bVar2 < 0x3f) {
    if (bVar2 == 0x2a) {
      exp->_p = (char *)(pbVar3 + 1);
      uVar15 = 0xffff;
LAB_0010af91:
      bVar5 = false;
      uVar10 = 0;
      goto LAB_0010afd7;
    }
    uVar15 = 0;
    uVar10 = 0;
    if (bVar2 != 0x2b) goto LAB_0010afd7;
    exp->_p = (char *)(pbVar3 + 1);
    uVar15 = 0xffff;
    uVar10 = 0x10000;
  }
  else {
    if (bVar2 == 0x3f) {
      exp->_p = (char *)(pbVar3 + 1);
      uVar15 = 1;
      goto LAB_0010af91;
    }
    uVar15 = 0;
    if (bVar2 != 0x7b) goto LAB_0010afd7;
    exp->_p = (char *)(pbVar3 + 1);
    ppuVar11 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar11 + (long)(char)pbVar3[1] * 2 + 1) & 8) == 0) {
      ppcVar12 = exp->_error;
      if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
      pcVar13 = "number expected";
LAB_0010b0d3:
      *ppcVar12 = pcVar13;
LAB_0010b0d6:
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    uVar10 = trex_parsenumber(exp);
    pcVar13 = exp->_p;
    if (*pcVar13 == ',') {
      exp->_p = pcVar13 + 1;
      uVar15 = 0xffff;
      if ((*(byte *)((long)*ppuVar11 + (long)pcVar13[1] * 2 + 1) & 8) != 0) {
        uVar15 = trex_parsenumber(exp);
      }
      trex_expect(exp,0x7d);
    }
    else {
      if (*pcVar13 != '}') {
        ppcVar12 = exp->_error;
        if (ppcVar12 == (char **)0x0) goto LAB_0010b0d6;
        pcVar13 = ", or } expected";
        goto LAB_0010b0d3;
      }
      exp->_p = pcVar13 + 1;
      uVar15 = uVar10;
    }
    uVar10 = uVar10 << 0x10;
    uVar15 = uVar15 & 0xffff;
  }
  bVar5 = false;
LAB_0010afd7:
  iVar7 = iVar6;
  if (!bVar5) {
    iVar7 = trex_newnode(exp,0x100);
    pTVar4 = exp->_nodes;
    pTVar4[iVar7].left = iVar6;
    pTVar4[iVar7].right = uVar15 | uVar10;
  }
  bVar2 = *exp->_p;
  if (((0x2b < (ulong)bVar2) || ((0xe0000000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
     (bVar2 != 0x7c)) {
    iVar6 = trex_element(exp);
    exp->_nodes[iVar7].next = iVar6;
  }
  return iVar7;
}

Assistant:

static int trex_element(TRex* exp) {
    int ret = -1;
    switch (*exp->_p) {
        case '(': {
            int expr, newn;
            exp->_p++;

            if (*exp->_p == '?') {
                exp->_p++;
                trex_expect(exp, ':');
                expr = trex_newnode(exp, OP_NOCAPEXPR);
            } else
                expr = trex_newnode(exp, OP_EXPR);
            newn = trex_list(exp);
            exp->_nodes[expr].left = newn;
            ret = expr;
            trex_expect(exp, ')');
        } break;
        case '[':
            exp->_p++;
            ret = trex_class(exp);
            trex_expect(exp, ']');
            break;
        case TREX_SYMBOL_END_OF_STRING:
            exp->_p++;
            ret = trex_newnode(exp, OP_EOL);
            break;
        case TREX_SYMBOL_ANY_CHAR:
            exp->_p++;
            ret = trex_newnode(exp, OP_DOT);
            break;
        default:
            ret = trex_charnode(exp, TRex_False);
            break;
    }

    {
        TRexBool isgreedy = TRex_False;
        unsigned short p0 = 0, p1 = 0;
        switch (*exp->_p) {
            case TREX_SYMBOL_GREEDY_ZERO_OR_MORE:
                p0 = 0;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ONE_OR_MORE:
                p0 = 1;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ZERO_OR_ONE:
                p0 = 0;
                p1 = 1;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case '{':
                exp->_p++;
                if (!isdigit((int)(*exp->_p)))
                    trex_error(exp, _SC("number expected"));
                p0 = (unsigned short)trex_parsenumber(exp);
                /*******************************/
                switch (*exp->_p) {
                    case '}':
                        p1 = p0;
                        exp->_p++;
                        break;
                    case ',':
                        exp->_p++;
                        p1 = 0xFFFF;
                        if (isdigit((int)(*exp->_p))) {
                            p1 = (unsigned short)trex_parsenumber(exp);
                        }
                        trex_expect(exp, '}');
                        break;
                    default:
                        trex_error(exp, _SC(", or } expected"));
                }
                /*******************************/
                isgreedy = TRex_True;
                break;
        }
        if (isgreedy) {
            int nnode = trex_newnode(exp, OP_GREEDY);
            exp->_nodes[nnode].left = ret;
            exp->_nodes[nnode].right = ((p0) << 16) | p1;
            ret = nnode;
        }
    }
    if ((*exp->_p != TREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != TREX_SYMBOL_GREEDY_ZERO_OR_MORE) &&
        (*exp->_p != TREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        int nnode = trex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}